

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixClose(sqlite3_file *id)

{
  _func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 **pp_Var1;
  sqlite3_io_methods *p;
  sqlite3_io_methods *psVar2;
  sqlite3_mutex *psVar3;
  unixInodeInfo **ppuVar4;
  unixInodeInfo *pInode;
  
  verifyDbFile((unixFile *)id);
  psVar3 = (sqlite3_mutex *)0x0;
  unixUnlock(id,0);
  if (sqlite3Config.bCoreMutex != 0) {
    psVar3 = (*sqlite3Config.mutex.xMutexAlloc)(0xb);
  }
  if (psVar3 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar3);
  }
  p = id[2].pMethods;
  if (p != (sqlite3_io_methods *)0x0) {
    if (*(int *)&p->xSync != 0) {
      psVar2 = id[6].pMethods;
      psVar2->xClose = (_func_int_sqlite3_file_ptr *)p->xFileSize;
      p->xFileSize = (_func_int_sqlite3_file_ptr_sqlite3_int64_ptr *)psVar2;
      *(undefined4 *)&id[3].pMethods = 0xffffffff;
      id[6].pMethods = (sqlite3_io_methods *)0x0;
    }
    if (p != (sqlite3_io_methods *)0x0) {
      pp_Var1 = &p->xWrite;
      *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
      if (*(int *)pp_Var1 == 0) {
        closePendingFds((unixFile *)id);
        ppuVar4 = &inodeList;
        if (p->xUnlock != (_func_int_sqlite3_file_ptr_int *)0x0) {
          ppuVar4 = (unixInodeInfo **)(p->xUnlock + 0x38);
        }
        *ppuVar4 = (unixInodeInfo *)p->xLock;
        if (p->xLock != (_func_int_sqlite3_file_ptr_int *)0x0) {
          *(_func_int_sqlite3_file_ptr_int **)(p->xLock + 0x40) = p->xUnlock;
        }
        sqlite3_free(p);
      }
    }
  }
  closeUnixFile(id);
  if (sqlite3Config.bCoreMutex == 0) {
    psVar3 = (sqlite3_mutex *)0x0;
  }
  else {
    psVar3 = (*sqlite3Config.mutex.xMutexAlloc)(0xb);
  }
  if (psVar3 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar3);
  }
  return 0;
}

Assistant:

static int unixClose(sqlite3_file *id){
  int rc = SQLITE_OK;
  unixFile *pFile = (unixFile *)id;
  verifyDbFile(pFile);
  unixUnlock(id, NO_LOCK);
  unixEnterMutex();

  /* unixFile.pInode is always valid here. Otherwise, a different close
  ** routine (e.g. nolockClose()) would be called instead.
  */
  assert( pFile->pInode->nLock>0 || pFile->pInode->bProcessLock==0 );
  if( ALWAYS(pFile->pInode) && pFile->pInode->nLock ){
    /* If there are outstanding locks, do not actually close the file just
    ** yet because that would clear those locks.  Instead, add the file
    ** descriptor to pInode->pUnused list.  It will be automatically closed 
    ** when the last lock is cleared.
    */
    setPendingFd(pFile);
  }
  releaseInodeInfo(pFile);
  rc = closeUnixFile(id);
  unixLeaveMutex();
  return rc;
}